

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

_Bool array_container_validate(array_container_t *v,char **reason)

{
  ushort *puVar1;
  int iVar2;
  ushort *puVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  
  if (v->capacity < 0) {
    pcVar4 = "negative capacity";
  }
  else {
    iVar2 = v->cardinality;
    uVar6 = (ulong)iVar2;
    if ((long)uVar6 < 0) {
      pcVar4 = "negative cardinality";
    }
    else if (v->capacity < iVar2) {
      pcVar4 = "cardinality exceeds capacity";
    }
    else if (iVar2 < 0x1001) {
      if (iVar2 == 0) {
        pcVar4 = "zero cardinality";
      }
      else {
        puVar3 = v->array;
        if (puVar3 == (ushort *)0x0) {
          pcVar4 = "NULL array pointer";
        }
        else {
          if (iVar2 < 2) {
            return iVar2 < 2;
          }
          uVar5 = 1;
          uVar7 = *puVar3;
          while (puVar1 = puVar3 + uVar5, uVar7 < *puVar1) {
            uVar5 = uVar5 + 1;
            uVar7 = *puVar1;
            if (uVar6 == uVar5) {
              return uVar6 <= uVar5;
            }
          }
          pcVar4 = "array elements not strictly increasing";
        }
      }
    }
    else {
      pcVar4 = "cardinality exceeds DEFAULT_MAX_SIZE";
    }
  }
  *reason = pcVar4;
  return false;
}

Assistant:

bool array_container_validate(const array_container_t *v, const char **reason) {
    if (v->capacity < 0) {
        *reason = "negative capacity";
        return false;
    }
    if (v->cardinality < 0) {
        *reason = "negative cardinality";
        return false;
    }
    if (v->cardinality > v->capacity) {
        *reason = "cardinality exceeds capacity";
        return false;
    }
    if (v->cardinality > DEFAULT_MAX_SIZE) {
        *reason = "cardinality exceeds DEFAULT_MAX_SIZE";
        return false;
    }
    if (v->cardinality == 0) {
        *reason = "zero cardinality";
        return false;
    }

    if (v->array == NULL) {
        *reason = "NULL array pointer";
        return false;
    }
    uint16_t prev = v->array[0];
    for (int i = 1; i < v->cardinality; ++i) {
        if (v->array[i] <= prev) {
            *reason = "array elements not strictly increasing";
            return false;
        }
        prev = v->array[i];
    }

    return true;
}